

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O3

void StringFormatter<unsigned_long&,std::vector<unsigned_short,std::allocator<unsigned_short>>>::
     format<std::vector<unsigned_short,std::allocator<unsigned_short>>const>
               (ostream *os,char *fmt,vector<unsigned_short,_std::allocator<unsigned_short>_> *value
               )

{
  ostream *poVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *value_00;
  long lVar5;
  void *pvVar6;
  runtime_error *this;
  char *pcVar7;
  bool bVar8;
  uint uVar9;
  char *__nptr;
  char *pcVar10;
  char *q;
  ostream local_92;
  char *local_90;
  undefined8 local_88;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_80;
  long local_78;
  char *local_70;
  long local_68;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  do {
    cVar2 = *fmt;
    if (cVar2 == '%') {
      cVar2 = fmt[1];
      if (cVar2 != '%') {
        pcVar7 = fmt + (cVar2 == '-');
        cVar3 = fmt[(ulong)(cVar2 == '-') + 1];
        bVar8 = cVar3 == ' ' || cVar3 == '+';
        __nptr = pcVar7 + (ulong)bVar8 + 1;
        if (*__nptr == ',') {
          __nptr = pcVar7 + (ulong)bVar8 + 2;
          local_92 = (ostream)0x2c;
        }
        else if (*__nptr == '0') {
          __nptr = pcVar7 + (ulong)bVar8 + 2;
          local_92 = (ostream)0x30;
        }
        else {
          local_92 = (ostream)0x20;
        }
        local_68 = strtol(__nptr,&local_90,10);
        local_70 = (char *)CONCAT71(local_90._1_7_,(char)local_90);
        local_80 = value;
        if (*local_70 == '.') {
          pcVar10 = local_70 + 1;
          lVar5 = strtol(pcVar10,&local_90,10);
          local_88 = CONCAT71((int7)((ulong)pcVar7 >> 8),
                              pcVar10 != (char *)CONCAT71(local_90._1_7_,(char)local_90));
          local_78 = (long)(int)lVar5;
          pcVar7 = (char *)CONCAT71(local_90._1_7_,(char)local_90);
        }
        else {
          local_78 = 0;
          local_88 = 0;
          pcVar7 = local_70;
        }
        do {
          pcVar10 = pcVar7;
          cVar4 = *pcVar10;
          pvVar6 = memchr("qhlLzjt",(int)cVar4,8);
          value_00 = local_80;
          pcVar7 = pcVar10 + 1;
        } while (pvVar6 != (void *)0x0);
        pcVar7 = pcVar10;
        if ((cVar4 == 'I') && (pcVar7 = pcVar10 + 1, (byte)(pcVar10[2] | 2U) == 0x36)) {
          pcVar7 = pcVar10 + 3;
        }
        cVar4 = *pcVar7;
        StringFormatter<unsigned_long_&,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
        ::applytype(os,cVar4);
        lVar5 = *(long *)os;
        if (cVar3 == '+') {
          os[*(long *)(lVar5 + -0x18) + 0x19] =
               (ostream)((byte)os[*(long *)(lVar5 + -0x18) + 0x19] | 8);
          uVar9 = 0x10;
          if (cVar2 == '-') goto LAB_00106250;
        }
        else {
          os[*(long *)(lVar5 + -0x18) + 0x19] =
               (ostream)((byte)os[*(long *)(lVar5 + -0x18) + 0x19] & 0xf7);
          if (cVar2 != '-') goto LAB_00106267;
LAB_00106250:
          uVar9 = 0x20;
        }
        *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
             *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | uVar9;
LAB_00106267:
        if (__nptr == local_70) {
          *(undefined8 *)(os + *(long *)(lVar5 + -0x18) + 0x10) = 0;
        }
        else {
          *(long *)(os + *(long *)(lVar5 + -0x18) + 0x10) = (long)(int)local_68;
          if (cVar2 != '-' && cVar3 != '+') {
            *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) =
                 *(uint *)(os + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
          }
        }
        if ((char)local_88 != '\0') {
          *(long *)(os + *(long *)(lVar5 + -0x18) + 8) = local_78;
        }
        poVar1 = os + *(long *)(lVar5 + -0x18);
        if (os[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar1);
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = local_92;
        if ((cVar4 != 'b') ||
           (bVar8 = output_hex_data<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                              (os,value_00), !bVar8)) {
          pvVar6 = memchr("iduoxX",(int)cVar4,7);
          if ((pvVar6 != (void *)0x0) &&
             (std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                        (&local_48,value_00),
             local_48.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_48.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((cVar4 == 's') &&
             (std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                        (&local_60,value_00),
             local_60.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start != (pointer)0x0)) {
            operator_delete(local_60.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_60.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_60.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::operator<<(os,value_00);
        }
        *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
        StringFormatter<unsigned_long_&,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
        ::format(os,pcVar7 + (cVar4 != '\0'));
        return;
      }
      fmt = fmt + 2;
      local_90._0_1_ = '%';
    }
    else {
      if (cVar2 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fmt = fmt + 1;
      local_90._0_1_ = cVar2;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_90,1);
  } while( true );
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }